

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversePowerSeries.cpp
# Opt level: O0

RealType __thiscall
OpenMD::InversePowerSeries::getSuggestedCutoffRadius
          (InversePowerSeries *this,pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> atypes)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  AtomType *in_RDX;
  AtomType *in_RSI;
  long in_RDI;
  int ipstid2;
  int ipstid1;
  int atid2;
  int atid1;
  InversePowerSeries *in_stack_00000250;
  undefined8 local_8;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    initialize(in_stack_00000250);
  }
  iVar1 = AtomType::getIdent(in_RSI);
  iVar2 = AtomType::getIdent(in_RDX);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)iVar1);
  iVar1 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)iVar2);
  if ((iVar1 == -1) || (*pvVar3 == -1)) {
    local_8 = 0.0;
  }
  else {
    local_8 = 12.0;
  }
  return local_8;
}

Assistant:

RealType InversePowerSeries::getSuggestedCutoffRadius(
      pair<AtomType*, AtomType*> atypes) {
    if (!initialized_) initialize();

    int atid1   = atypes.first->getIdent();
    int atid2   = atypes.second->getIdent();
    int ipstid1 = InversePowerSeriesTids[atid1];
    int ipstid2 = InversePowerSeriesTids[atid2];

    if (ipstid1 == -1 || ipstid2 == -1)
      return 0.0;
    else {
      // This seems to work moderately well as a default.  There's no
      // inherent scale for 1/r^n interactions that we can standardize.
      // 12 angstroms seems to be a reasonably good guess for most
      // cases.
      return 12.0;
    }
  }